

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O3

void __thiscall CuToUtf8_All_Test::TestBody(CuToUtf8_All_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  *paVar2;
  char32_t in_EDX;
  char32_t extraout_EDX;
  char32_t extraout_EDX_00;
  char32_t extraout_EDX_01;
  char32_t extraout_EDX_02;
  char32_t extraout_EDX_03;
  char32_t cVar3;
  char32_t extraout_EDX_04;
  char32_t extraout_EDX_05;
  char32_t extraout_EDX_06;
  char32_t extraout_EDX_07;
  char32_t extraout_EDX_08;
  char32_t extraout_EDX_09;
  char32_t extraout_EDX_10;
  char32_t extraout_EDX_11;
  char32_t extraout_EDX_12;
  char32_t extraout_EDX_13;
  char32_t extraout_EDX_14;
  char32_t extraout_EDX_15;
  char32_t extraout_EDX_16;
  char32_t extraout_EDX_17;
  char32_t extraout_EDX_18;
  char32_t extraout_EDX_19;
  char32_t extraout_EDX_20;
  char32_t extraout_EDX_21;
  char32_t extraout_EDX_22;
  char32_t extraout_EDX_23;
  char32_t extraout_EDX_24;
  char32_t extraout_EDX_25;
  char32_t extraout_EDX_26;
  char32_t extraout_EDX_27;
  char32_t extraout_EDX_28;
  char32_t extraout_EDX_29;
  char32_t extraout_EDX_30;
  char32_t extraout_EDX_31;
  char32_t extraout_EDX_32;
  char32_t extraout_EDX_33;
  char32_t extraout_EDX_34;
  char32_t extraout_EDX_35;
  char32_t extraout_EDX_36;
  char32_t extraout_EDX_37;
  char32_t extraout_EDX_38;
  char32_t extraout_EDX_39;
  char32_t extraout_EDX_40;
  char32_t extraout_EDX_41;
  char32_t extraout_EDX_42;
  char32_t extraout_EDX_43;
  char32_t extraout_EDX_44;
  char32_t extraout_EDX_45;
  char32_t extraout_EDX_46;
  char32_t extraout_EDX_47;
  char32_t extraout_EDX_48;
  char32_t extraout_EDX_49;
  char32_t extraout_EDX_50;
  char32_t extraout_EDX_51;
  char32_t extraout_EDX_52;
  char32_t extraout_EDX_53;
  char32_t extraout_EDX_54;
  char32_t extraout_EDX_55;
  char32_t extraout_EDX_56;
  char32_t extraout_EDX_57;
  char32_t extraout_EDX_58;
  char32_t extraout_EDX_59;
  char32_t extraout_EDX_60;
  char32_t extraout_EDX_61;
  char32_t extraout_EDX_62;
  char32_t extraout_EDX_63;
  char32_t extraout_EDX_64;
  char32_t extraout_EDX_65;
  char32_t extraout_EDX_66;
  char32_t extraout_EDX_67;
  char32_t extraout_EDX_68;
  char *pcVar4;
  AssertionResult AVar5;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_58;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_38;
  
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0x1,in_EDX);
  paVar1 = &local_58.field_2;
  local_58.field_2._M_allocated_capacity._0_2_ = 1;
  local_58._M_string_length = 1;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x0001)","utf8_string ({0x01})",
                     &local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX;
  }
  paVar2 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_00;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x130,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_01;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_02;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_03;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0x24,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x24;
  local_58._M_string_length = 1;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x0024)","utf8_string ({0x24})",
                     &local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_05;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x131,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_06;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_07;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_08;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0xa2,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xa2c2;
  local_58._M_string_length = 2;
  local_58.field_2._M_local_buf[2] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x00A2)",
                     "utf8_string ({0xC2, 0xA2})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_09;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_10;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x132,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_11;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_12;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_13;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0x7f,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x7f;
  local_58._M_string_length = 1;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x007F)","utf8_string ({0x7F})",
                     &local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_15;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x134,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_16;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_17;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_18;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)&DAT_00000080,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x80c2;
  local_58._M_string_length = 2;
  local_58.field_2._M_local_buf[2] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x0080)",
                     "utf8_string ({0b11000010, 0x80})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_19;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_20;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x135,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_21;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_22;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_23;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0x7ff,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xbfdf;
  local_58._M_string_length = 2;
  local_58.field_2._M_local_buf[2] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x07FF)",
                     "utf8_string ({0b11011111, 0xBF})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_24;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_25;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x136,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_26;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_27;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_28;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)&DAT_00000800,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xa0e0;
  local_58.field_2._M_local_buf[2] = 0x80;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x0800)",
                     "utf8_string ({0xE0, 0xA0, 0x80})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_29;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_30;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x137,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_31;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_32;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_33;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0xd7ff,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x9fed;
  local_58.field_2._M_local_buf[2] = 0xbf;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0xD7FF)",
                     "utf8_string ({0xED, 0x9F, 0xBF})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_34;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_35;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x139,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_36;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_37;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_38;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0xd800,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xbfef;
  local_58.field_2._M_local_buf[2] = 0xbd;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0xD800)",
                     "utf8_string ({0xEF, 0xBF, 0xBD})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_39;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_40;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x13e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_41;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_42;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_43;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0xdfff,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xbfef;
  local_58.field_2._M_local_buf[2] = 0xbd;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0xDFFF)",
                     "utf8_string ({0xEF, 0xBF, 0xBD})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_44;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_45;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x13f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_46;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_47;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_48;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)0xe000,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x80ee;
  local_58.field_2._M_local_buf[2] = 0x80;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0xE000)",
                     "utf8_string ({0xEE, 0x80, 0x80})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_49;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_50;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_51;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_52;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_53;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)&DAT_0000ffff,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xbfef;
  local_58.field_2._M_local_buf[2] = 0xbf;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0xFFFF)",
                     "utf8_string ({0xEF, 0xBF, 0xBF})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_54;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_55;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_56;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_57;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_58;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)&DAT_00010000,cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x90f0;
  local_58.field_2._M_local_buf[2] = 0x80;
  local_58.field_2._M_local_buf[3] = 0x80;
  local_58._M_string_length = 4;
  local_58.field_2._M_allocated_capacity._4_4_ =
       local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x10000)",
                     "utf8_string ({0xF0, 0x90, 0x80, 0x80})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_59;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_60;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x143,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_61;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_62;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_63;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)((long)&__DT_RELA[0x820].r_addend + 7),cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0x8ff4;
  local_58.field_2._M_local_buf[2] = 0xbf;
  local_58.field_2._M_local_buf[3] = 0xbf;
  local_58._M_string_length = 4;
  local_58.field_2._M_allocated_capacity._4_4_ =
       local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  AVar5 = testing::internal::
          CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                    (local_68,"code_point_to_utf8<utf8_string> (0x10FFFF)",
                     "utf8_string ({0xF4, 0x8F, 0xBF, 0xBF})",&local_38,&local_58);
  cVar3 = (char32_t)
          AVar5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
    cVar3 = extraout_EDX_64;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3 = extraout_EDX_65;
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x144,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    cVar3 = extraout_EDX_66;
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      cVar3 = extraout_EDX_67;
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
    cVar3 = extraout_EDX_68;
  }
  pstore::utf::
  code_point_to_utf8<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_38,(utf *)(__DT_RELA + 0x821),cVar3);
  local_58.field_2._M_allocated_capacity._0_2_ = 0xbfef;
  local_58.field_2._M_local_buf[2] = 0xbd;
  local_58.field_2._M_local_buf[3] = '\0';
  local_58._M_string_length = 3;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  testing::internal::
  CmpHelperEQ<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (local_68,"code_point_to_utf8<utf8_string> (0x110000)",
             "utf8_string ({0xEF, 0xBF, 0xBD})",&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_58.field_2._M_local_buf[3],
                                      CONCAT12(local_58.field_2._M_local_buf[2],
                                               local_58.field_2._M_allocated_capacity._0_2_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x145,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST (CuToUtf8, All) {
    using namespace pstore::utf;

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0001), utf8_string ({0x01}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0024), utf8_string ({0x24}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x00A2), utf8_string ({0xC2, 0xA2}));

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x007F), utf8_string ({0x7F}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0080), utf8_string ({0b11000010, 0x80}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x07FF), utf8_string ({0b11011111, 0xBF}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0800), utf8_string ({0xE0, 0xA0, 0x80}));

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xD7FF), utf8_string ({0xED, 0x9F, 0xBF}));

    // Since RFC 3629 (November 2003), the high and low surrogate halves used by UTF-16 (U+D800
    // through U+DFFF) and code points not
    // encodable by UTF-16 (those after U+10FFFF) are not legal Unicode values
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xD800), utf8_string ({0xEF, 0xBF, 0xBD}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xDFFF), utf8_string ({0xEF, 0xBF, 0xBD}));

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xE000), utf8_string ({0xEE, 0x80, 0x80}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xFFFF), utf8_string ({0xEF, 0xBF, 0xBF}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x10000), utf8_string ({0xF0, 0x90, 0x80, 0x80}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x10FFFF), utf8_string ({0xF4, 0x8F, 0xBF, 0xBF}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x110000), utf8_string ({0xEF, 0xBF, 0xBD}));
}